

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_base64.c
# Opt level: O0

char * cmime_base64_encode_string(char *source)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int target_len;
  int source_len;
  int pos;
  char *target;
  int local_20;
  int len;
  int j;
  int i;
  uchar out [4];
  char *pcStack_10;
  uchar in [3];
  char *source_local;
  
  target_len = 0;
  pcStack_10 = source;
  sVar2 = strlen(source);
  iVar1 = (int)sVar2;
  pcVar3 = (char *)calloc((long)(int)((double)iVar1 * 0.35 + (double)iVar1 + 1.0),2);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 3) {
    target._4_4_ = 0;
    for (len = 0; len < 3; len = len + 1) {
      if (len + local_20 < iVar1) {
        *(char *)((long)&i + (long)len + 1) = pcStack_10[local_20 + len];
        target._4_4_ = target._4_4_ + 1;
      }
      else {
        *(undefined1 *)((long)&i + (long)len + 1) = 0;
      }
    }
    cmime_base64_encode_block((uchar *)((long)&i + 1),(uchar *)((long)&j + 1),target._4_4_);
    for (len = 0; len < 4; len = len + 1) {
      pcVar3[target_len] = *(char *)((long)&j + (long)len + 1);
      target_len = target_len + 1;
    }
  }
  return pcVar3;
}

Assistant:

char *cmime_base64_encode_string(const char *source) {
    unsigned char in[3], out[4];
    int i,j;
    int len;
    char *target = NULL;
    int pos = 0;

    /* laenge der ein/ausgabe */
    int source_len = strlen(source);
    int target_len = source_len + (0.35 * source_len) + 1;

    target = (char *)calloc(target_len, sizeof(char) + 1);

    for(j=0; j<source_len; j+=3) {
        len = 0;

        for(i=0; i<3; i++) {
            if((i + j) < source_len) {
                in[i] = (unsigned char)source[j + i];
                len++;
            } else {
                in[i] = 0;
            }
        }

        cmime_base64_encode_block(in, out, len);
        for(i=0; i<4; i++) {
            target[pos++] = out[i];
        }
    }

    return(target);
}